

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O3

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  uint uVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  float *pfVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  unsigned_long uVar22;
  long lVar23;
  uint *puVar24;
  ulong uVar25;
  long lVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  ulong local_f8;
  PrimRef *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [8];
  long local_88;
  BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_> *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68 [8];
  uint local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar22 = set->_begin;
  uVar15 = (set->_end - uVar22) + 3;
  local_f8 = uVar15 >> 2;
  local_108 = local_f8 * 0xb0;
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  local_f0 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_78);
    }
    else {
      *__position._M_current = this_01;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar25 = local_108;
  pTVar5->bytesUsed = pTVar5->bytesUsed + local_108;
  sVar19 = pTVar5->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar16 = sVar19 + local_108 + uVar20;
  pTVar5->cur = uVar16;
  if (pTVar5->end < uVar16) {
    pTVar5->cur = sVar19;
    uVar16 = pTVar5->allocBlockSize;
    if (local_108 * 4 < uVar16 || local_108 * 4 - uVar16 == 0) {
      local_e8 = (undefined8 *)uVar16;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar5->ptr = pcVar17;
      sVar19 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar19;
      pTVar5->end = (size_t)local_e8;
      pTVar5->cur = uVar25;
      if (local_e8 < uVar25) {
        pTVar5->cur = 0;
        local_e8 = (undefined8 *)pTVar5->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar5->ptr = pcVar17;
        sVar19 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar19;
        pTVar5->end = (size_t)local_e8;
        pTVar5->cur = uVar25;
        if (local_e8 < uVar25) {
          pTVar5->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00bfa42c;
        }
      }
      pTVar5->bytesWasted = sVar19;
    }
    else {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_108);
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar20;
    pcVar17 = pTVar5->ptr + (uVar16 - local_108);
  }
LAB_00bfa42c:
  if (3 < uVar15) {
    lVar23 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar21 = 0;
    local_88 = lVar23;
    local_80 = this;
    do {
      uVar15 = set->_end;
      fVar30 = -NAN;
      fVar27 = -NAN;
      fVar28 = -NAN;
      fVar29 = -NAN;
      local_108._0_4_ = -NAN;
      local_108._4_4_ = -NAN;
      fStack_100 = -NAN;
      fStack_fc = -NAN;
      local_48 = 0xffffffff;
      fStack_44 = -NAN;
      fStack_40 = -NAN;
      fStack_3c = -NAN;
      local_d8[4] = 0.0;
      local_d8[5] = 0.0;
      local_d8[6] = 0.0;
      local_d8[7] = 0.0;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      local_d8[3] = 0.0;
      local_e8 = (undefined8 *)0x0;
      uStack_e0 = 0;
      local_a8[4] = 0.0;
      local_a8[5] = 0.0;
      local_a8[6] = 0.0;
      local_a8[7] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_68[4] = 0.0;
      local_68[5] = 0.0;
      local_68[6] = 0.0;
      local_68[7] = 0.0;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      if (uVar22 < uVar15) {
        pRVar6 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar24 = (uint *)((long)local_f0 + uVar22 * 0x20);
        uVar25 = 0;
        do {
          uVar4 = *puVar24;
          pGVar7 = pRVar6[puVar24[-4]].ptr;
          lVar26 = (ulong)uVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar23 = *(long *)&pGVar7->field_0x58;
          lVar8 = *(long *)&pGVar7[1].time_range.upper;
          p_Var9 = pGVar7[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar23 + lVar26) * (long)p_Var9);
          uVar10 = *puVar2;
          fVar27 = (float)puVar2[1];
          fVar28 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar23 + 4 + lVar26) * (long)p_Var9);
          uVar11 = *puVar2;
          fVar29 = (float)puVar2[1];
          fVar30 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar23 + 8 + lVar26) * (long)p_Var9);
          uVar12 = *puVar2;
          fVar13 = (float)puVar2[1];
          fVar14 = (float)puVar2[2];
          *(uint *)((long)&local_108 + uVar25 * 4) = puVar24[-4];
          (&local_48)[uVar25] = uVar4;
          *(undefined4 *)((long)&local_e8 + uVar25 * 4) = uVar10;
          local_d8[uVar25] = fVar27;
          local_d8[uVar25 + 4] = fVar28;
          *(undefined4 *)((long)&local_b8 + uVar25 * 4) = uVar11;
          local_a8[uVar25] = fVar29;
          local_a8[uVar25 + 4] = fVar30;
          *(undefined4 *)((long)&local_78 + uVar25 * 4) = uVar12;
          local_68[uVar25] = fVar13;
          local_68[uVar25 + 4] = fVar14;
          uVar16 = uVar25 + 1;
          if (2 < uVar25) break;
          lVar23 = uVar25 + uVar22;
          puVar24 = puVar24 + 8;
          uVar25 = uVar16;
        } while (lVar23 + 1U < uVar15);
        uVar22 = uVar22 + uVar16;
        lVar23 = local_88;
        this = local_80;
        fVar27 = (float)local_48;
        fVar28 = fStack_44;
        fVar29 = fStack_40;
        fVar30 = fStack_3c;
      }
      else {
        fStack_fc = -NAN;
        local_108._0_4_ = -NAN;
        local_108._4_4_ = -NAN;
        fStack_100 = -NAN;
        local_68[4] = 0.0;
        local_68[5] = 0.0;
        local_68[6] = 0.0;
        local_68[7] = 0.0;
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        local_68[3] = 0.0;
        local_78._0_4_ = 0.0;
        local_78._4_4_ = 0.0;
        uStack_70._0_4_ = 0.0;
        uStack_70._4_4_ = 0.0;
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        local_a8[2] = 0.0;
        local_a8[3] = 0.0;
        local_b8._0_4_ = 0.0;
        local_b8._4_4_ = 0.0;
        uStack_b0._0_4_ = 0.0;
        uStack_b0._4_4_ = 0.0;
        local_d8[4] = 0.0;
        local_d8[5] = 0.0;
        local_d8[6] = 0.0;
        local_d8[7] = 0.0;
        local_d8[0] = 0.0;
        local_d8[1] = 0.0;
        local_d8[2] = 0.0;
        local_d8[3] = 0.0;
        local_e8._0_4_ = 0.0;
        local_e8._4_4_ = 0.0;
        uStack_e0._0_4_ = 0.0;
        uStack_e0._4_4_ = 0.0;
      }
      pfVar18 = (float *)(pcVar17 + lVar21 * 0xb0);
      *pfVar18 = (float)local_e8;
      pfVar18[1] = local_e8._4_4_;
      pfVar18[2] = (float)uStack_e0;
      pfVar18[3] = uStack_e0._4_4_;
      pfVar18[4] = local_d8[0];
      pfVar18[5] = local_d8[1];
      pfVar18[6] = local_d8[2];
      pfVar18[7] = local_d8[3];
      pfVar18[8] = local_d8[4];
      pfVar18[9] = local_d8[5];
      pfVar18[10] = local_d8[6];
      pfVar18[0xb] = local_d8[7];
      pfVar18[0xc] = (float)local_e8 - (float)local_b8;
      pfVar18[0xd] = local_e8._4_4_ - local_b8._4_4_;
      pfVar18[0xe] = (float)uStack_e0 - (float)uStack_b0;
      pfVar18[0xf] = uStack_e0._4_4_ - uStack_b0._4_4_;
      pfVar18[0x10] = local_d8[0] - local_a8[0];
      pfVar18[0x11] = local_d8[1] - local_a8[1];
      pfVar18[0x12] = local_d8[2] - local_a8[2];
      pfVar18[0x13] = local_d8[3] - local_a8[3];
      pfVar18[0x14] = local_d8[4] - local_a8[4];
      pfVar18[0x15] = local_d8[5] - local_a8[5];
      pfVar18[0x16] = local_d8[6] - local_a8[6];
      pfVar18[0x17] = local_d8[7] - local_a8[7];
      pfVar18[0x18] = (float)local_78 - (float)local_e8;
      pfVar18[0x19] = local_78._4_4_ - local_e8._4_4_;
      pfVar18[0x1a] = (float)uStack_70 - (float)uStack_e0;
      pfVar18[0x1b] = uStack_70._4_4_ - uStack_e0._4_4_;
      pfVar18[0x1c] = local_68[0] - local_d8[0];
      pfVar18[0x1d] = local_68[1] - local_d8[1];
      pfVar18[0x1e] = local_68[2] - local_d8[2];
      pfVar18[0x1f] = local_68[3] - local_d8[3];
      pfVar18[0x20] = local_68[4] - local_d8[4];
      pfVar18[0x21] = local_68[5] - local_d8[5];
      pfVar18[0x22] = local_68[6] - local_d8[6];
      pfVar18[0x23] = local_68[7] - local_d8[7];
      pfVar18[0x24] = (float)local_108;
      pfVar18[0x25] = local_108._4_4_;
      pfVar18[0x26] = fStack_100;
      pfVar18[0x27] = fStack_fc;
      pfVar18[0x28] = fVar27;
      pfVar18[0x29] = fVar28;
      pfVar18[0x2a] = fVar29;
      pfVar18[0x2b] = fVar30;
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar23);
  }
  uVar15 = 7;
  if (local_f8 < 7) {
    uVar15 = local_f8;
  }
  return (NodeRef)(uVar15 | (ulong)pcVar17 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }